

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFPageObjectHelper.cc
# Opt level: O2

QPDFObjectHandle __thiscall
QPDFPageObjectHelper::getFormXObjectForPage(QPDFPageObjectHelper *this,bool handle_transformations)

{
  BaseHandle *pBVar1;
  bool bVar2;
  StreamDataProvider *this_00;
  char in_DL;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined7 in_register_00000031;
  QPDFPageObjectHelper *this_01;
  QPDFObjectHandle QVar3;
  QPDFObjectHandle bbox;
  string local_f0;
  allocator<char> local_c9;
  undefined1 local_c8 [48];
  shared_ptr<QPDFObjectHandle::StreamDataProvider> provider;
  QPDFObjectHandle newdict;
  QPDFObjectHandle rotate_obj;
  QPDFObjectHandle scale_obj;
  undefined1 local_58 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  this_01 = (QPDFPageObjectHelper *)CONCAT71(in_register_00000031,handle_transformations);
  pBVar1 = &(this_01->super_QPDFObjectHelper).super_BaseHandle;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_f0,
             (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,
             "QPDFPageObjectHelper::getFormXObjectForPage called with a direct object",
             (allocator<char> *)&newdict);
  QPDFObjectHandle::getQPDF((QPDFObjectHandle *)&local_f0,(string *)local_c8);
  QPDF::newStream((QPDF *)this);
  std::__cxx11::string::~string((string *)local_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
  QPDFObjectHandle::getDict(&newdict);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"/Type",(allocator<char> *)&provider);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"/XObject",(allocator<char> *)&rotate_obj);
  QPDFObjectHandle::newName((string *)&bbox);
  QPDFObjectHandle::replaceKey(&newdict,(string *)local_c8,&bbox);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bbox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"/Subtype",(allocator<char> *)&provider);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"/Form",(allocator<char> *)&rotate_obj);
  QPDFObjectHandle::newName((string *)&bbox);
  QPDFObjectHandle::replaceKey(&newdict,(string *)local_c8,&bbox);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bbox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"/Resources",(allocator<char> *)&rotate_obj);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"/Resources",(allocator<char> *)&scale_obj);
  getAttribute((QPDFPageObjectHelper *)&provider,(string *)this_01,SUB81(&local_f0,0));
  QPDFObjectHandle::shallowCopy(&bbox);
  QPDFObjectHandle::replaceKey(&newdict,(string *)local_c8,&bbox);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bbox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&provider.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"/Group",(allocator<char> *)&rotate_obj);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f0,"/Group",(allocator<char> *)&scale_obj);
  getAttribute((QPDFPageObjectHelper *)&provider,(string *)this_01,SUB81(&local_f0,0));
  QPDFObjectHandle::shallowCopy(&bbox);
  QPDFObjectHandle::replaceKey(&newdict,(string *)local_c8,&bbox);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bbox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&provider.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)local_c8);
  getTrimBox((QPDFPageObjectHelper *)local_c8,handle_transformations,false);
  QPDFObjectHandle::shallowCopy(&bbox);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  bVar2 = QPDFObjectHandle::isRectangle(&bbox);
  if (!bVar2) {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&local_f0,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_c8,
               "bounding box is invalid; form XObject created from page will not work",
               (allocator<char> *)&provider);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&local_f0,(string *)local_c8);
    std::__cxx11::string::~string((string *)local_c8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"/BBox",(allocator<char> *)&local_f0);
  QPDFObjectHandle::replaceKey(&newdict,(string *)local_c8,&bbox);
  std::__cxx11::string::~string((string *)local_c8);
  this_00 = (StreamDataProvider *)operator_new(0x20);
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_38,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)pBVar1);
  QPDFObjectHandle::StreamDataProvider::StreamDataProvider(this_00,false);
  this_00->_vptr_StreamDataProvider = (_func_int **)&PTR__ContentProvider_002b2f40;
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(this_00 + 1),&local_38);
  provider.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  provider.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = this_00;
  provider.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x18);
  (provider.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_use_count = 1;
  (provider.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_M_weak_count = 1;
  (provider.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
   _M_refcount._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_base_002b3038;
  provider.super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi[1]._vptr__Sp_counted_base = (_func_int **)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  std::__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2> *)
             (local_58 + 0x10),
             &provider.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>);
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::newNull();
  QPDFObjectHandle::replaceStreamData
            ((QPDFObjectHandle *)this,
             (shared_ptr<QPDFObjectHandle::StreamDataProvider> *)(local_58 + 0x10),
             (QPDFObjectHandle *)local_c8,(QPDFObjectHandle *)&local_f0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_f0._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"/Rotate",(allocator<char> *)&local_f0);
  getAttribute((QPDFPageObjectHelper *)&rotate_obj,(string *)this_01,SUB81(local_c8,0));
  std::__cxx11::string::~string((string *)local_c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_c8,"/UserUnit",(allocator<char> *)&local_f0);
  getAttribute((QPDFPageObjectHelper *)&scale_obj,(string *)this_01,SUB81(local_c8,0));
  std::__cxx11::string::~string((string *)local_c8);
  if (in_DL != '\0') {
    bVar2 = QPDFObjectHandle::isNull(&rotate_obj);
    if (bVar2) {
      bVar2 = QPDFObjectHandle::isNull(&scale_obj);
      if (bVar2) goto LAB_001aa65e;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"/Matrix",&local_c9);
    getMatrixForTransformations((Matrix *)local_c8,this_01,false);
    QPDFObjectHandle::newArray((Matrix *)local_58);
    QPDFObjectHandle::replaceKey(&newdict,&local_f0,(QPDFObjectHandle *)local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_58 + 8));
    std::__cxx11::string::~string((string *)&local_f0);
  }
LAB_001aa65e:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&scale_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rotate_obj.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&provider.
              super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&bbox.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&newdict.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (QPDFObjectHandle)
         QVar3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

QPDFObjectHandle
QPDFPageObjectHelper::getFormXObjectForPage(bool handle_transformations)
{
    auto result =
        oh().getQPDF("QPDFPageObjectHelper::getFormXObjectForPage called with a direct object")
            .newStream();
    QPDFObjectHandle newdict = result.getDict();
    newdict.replaceKey("/Type", QPDFObjectHandle::newName("/XObject"));
    newdict.replaceKey("/Subtype", QPDFObjectHandle::newName("/Form"));
    newdict.replaceKey("/Resources", getAttribute("/Resources", false).shallowCopy());
    newdict.replaceKey("/Group", getAttribute("/Group", false).shallowCopy());
    QPDFObjectHandle bbox = getTrimBox(false).shallowCopy();
    if (!bbox.isRectangle()) {
        oh().warnIfPossible(
            "bounding box is invalid; form XObject created from page will not work");
    }
    newdict.replaceKey("/BBox", bbox);
    auto provider =
        std::shared_ptr<QPDFObjectHandle::StreamDataProvider>(new ContentProvider(oh()));
    result.replaceStreamData(provider, QPDFObjectHandle::newNull(), QPDFObjectHandle::newNull());
    QPDFObjectHandle rotate_obj = getAttribute("/Rotate", false);
    QPDFObjectHandle scale_obj = getAttribute("/UserUnit", false);
    if (handle_transformations && (!(rotate_obj.isNull() && scale_obj.isNull()))) {
        newdict.replaceKey("/Matrix", QPDFObjectHandle::newArray(getMatrixForTransformations()));
    }

    return result;
}